

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_suite.cpp
# Opt level: O0

void search_array(void)

{
  size_type in_RCX;
  size_type sVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_03;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_940;
  basic_variable<std::allocator<char>_> *local_920;
  basic_variable<std::allocator<char>_> *local_8f8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_8e0;
  basic_variable<std::allocator<char>_> *local_8c8;
  undefined1 local_8a9;
  basic_variable<std::allocator<char>_> local_8a8;
  iterator local_878;
  iterator local_860;
  undefined1 local_847 [2];
  undefined1 local_845;
  int local_844;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_840;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_838;
  undefined1 local_7d8 [72];
  iterator local_790;
  iterator local_778;
  undefined1 local_75b [2];
  undefined1 local_759;
  basic_variable<std::allocator<char>_> local_758;
  iterator local_728;
  iterator local_710;
  undefined1 local_6f3 [2];
  undefined1 local_6f1;
  basic_variable<std::allocator<char>_> *local_6f0;
  basic_variable<std::allocator<char>_> local_6e8;
  undefined1 local_6b8 [72];
  iterator local_670;
  iterator local_658;
  undefined1 local_63b [2];
  undefined1 local_639;
  iterator local_638;
  iterator local_620;
  undefined1 local_603 [2];
  undefined1 local_601;
  iterator local_600;
  iterator local_5e8;
  undefined1 local_5cb [2];
  undefined1 local_5c9;
  iterator local_5c8;
  iterator local_5b0;
  undefined1 local_593 [2];
  undefined1 local_591;
  iterator local_590;
  iterator local_578;
  undefined1 local_55b [2];
  undefined1 local_559;
  iterator local_558;
  iterator local_540;
  undefined1 local_523 [2];
  undefined1 local_521;
  iterator local_520;
  iterator local_508;
  undefined1 local_4eb [2];
  undefined1 local_4e9;
  iterator local_4e8;
  iterator local_4d0;
  undefined1 local_4b3 [2];
  undefined1 local_4b1;
  iterator local_4b0;
  iterator local_498;
  undefined1 local_47b [2];
  undefined1 local_479;
  double local_478;
  iterator local_470;
  iterator local_458;
  undefined1 local_43b [2];
  undefined1 local_439;
  double local_438;
  iterator local_430;
  iterator local_418;
  undefined1 local_3ff [2];
  undefined1 local_3fd;
  int local_3fc;
  iterator local_3f8;
  iterator local_3e0;
  undefined1 local_3c7 [2];
  undefined1 local_3c5;
  int local_3c4;
  iterator local_3c0;
  iterator local_3a8;
  undefined1 local_38c [2];
  undefined1 local_38a;
  bool local_389;
  iterator local_388;
  iterator local_370;
  undefined1 local_354 [2];
  undefined1 local_352;
  bool local_351;
  iterator local_350;
  iterator local_338;
  undefined1 local_31f [2];
  undefined1 local_31d;
  nullable local_31c;
  iterator local_318;
  iterator local_300;
  undefined1 local_2e7 [2];
  undefined1 local_2e5;
  int local_2e4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_2e0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_2d8;
  undefined1 auStack_278 [80];
  undefined1 local_228 [48];
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_2e5 = 1;
  local_228._40_8_ = &local_1f8;
  local_228._36_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_228._40_8_,
             (nullable *)(local_228 + 0x24));
  local_228._40_8_ = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_228._40_8_,true);
  local_228._40_8_ = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_228._40_8_,2);
  local_228._40_8_ = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_228._40_8_,3.0);
  local_228._40_8_ = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_228._40_8_,"alpha");
  local_228._40_8_ = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_228._40_8_,L"bravo");
  local_228._40_8_ = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_228._40_8_,L"charlie");
  auStack_278._24_8_ = auStack_278 + 0x20;
  local_228._40_8_ = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)auStack_278._24_8_,5);
  local_228._0_8_ = auStack_278 + 0x20;
  local_228._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            (&local_a8,(basic_array<std::allocator<char>_> *)local_228._0_8_,init);
  local_2e0 = &local_2d8;
  local_2e4 = 6;
  local_228._40_8_ = &local_78;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_2e0,(char (*) [6])"alice",&local_2e4);
  auStack_278._8_8_ = &local_2d8;
  auStack_278._16_8_ = 1;
  init_00._M_len = in_RCX;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            (&local_78,(basic_map<std::allocator<char>_> *)auStack_278._8_8_,init_00);
  local_2e5 = 0;
  local_48._0_8_ = &local_1f8;
  local_48._8_8_ = 9;
  init_01._M_len = in_RCX;
  init_01._M_array = (iterator)0x9;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init_01);
  local_8c8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_8c8 = local_8c8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8c8);
  } while (local_8c8 != &local_1f8);
  local_8e0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)auStack_278;
  do {
    local_8e0 = local_8e0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_8e0);
  } while (local_8e0 != &local_2d8);
  local_8f8 = (basic_variable<std::allocator<char>_> *)local_228;
  do {
    local_8f8 = local_8f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8f8);
  } while (local_8f8 != (basic_variable<std::allocator<char>_> *)(auStack_278 + 0x20));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_318,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_31c = null;
  local_2e7[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::nullable>
                           (&local_300,&local_318,&local_31c);
  local_31d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), null)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x90,"void search_array()",local_2e7,&local_31d);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_338,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_350,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_351 = false;
  local_31f[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
                           (&local_338,&local_350,&local_351);
  local_352 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x91,"void search_array()",local_31f,&local_352);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_370,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_388,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_389 = true;
  local_354[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
                           (&local_370,&local_388,&local_389);
  local_38a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x92,"void search_array()",local_354,&local_38a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3c0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_3c4 = 2;
  local_38c[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
                           (&local_3a8,&local_3c0,&local_3c4);
  local_3c5 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), 2)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x93,"void search_array()",local_38c,&local_3c5);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_3fc = 0x2a;
  local_3c7[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
                           (&local_3e0,&local_3f8,&local_3fc);
  local_3fd = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), 42)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x94,"void search_array()",local_3c7,&local_3fd);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_418,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_430,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_438 = 3.0;
  local_3ff[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
                           (&local_418,&local_430,&local_438);
  local_439 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), 3.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x95,"void search_array()",local_3ff,&local_439);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_430);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_458,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_470,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_478 = 43.0;
  local_43b[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
                           (&local_458,&local_470,&local_478);
  local_479 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), 43.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x96,"void search_array()",local_43b,&local_479);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_470);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_498,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_47b[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[6]>
                           (&local_498,&local_4b0,(char (*) [6])"alpha");
  local_4b1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), \"alpha\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x97,"void search_array()",local_47b,&local_4b1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_4b3[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[5]>
                           (&local_4d0,&local_4e8,(char (*) [5])"zulu");
  local_4e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), \"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x98,"void search_array()",local_4b3,&local_4e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_508,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_520,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_4eb[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[6]>
                           (&local_508,&local_520,(wchar_t (*) [6])L"bravo");
  local_521 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), L\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x99,"void search_array()",local_4eb,&local_521);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_520);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_508);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_540,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_558,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_523[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[5]>
                           (&local_540,&local_558,(wchar_t (*) [5])L"zulu");
  local_559 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), L\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x9a,"void search_array()",local_523,&local_559);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_540);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_578,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_590,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_55b[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[8]>
                           (&local_578,&local_590,(char16_t (*) [8])L"charlie");
  local_591 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), u\"charlie\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x9b,"void search_array()",local_55b,&local_591);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_590);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_578);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_593[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[5]>
                           (&local_5b0,&local_5c8,(char16_t (*) [5])L"zulu");
  local_5c9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), u\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x9c,"void search_array()",local_593,&local_5c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_600,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_5cb[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[6]>
                           (&local_5e8,&local_600,(char32_t (*) [6])L"delta");
  local_601 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), U\"delta\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x9d,"void search_array()",local_5cb,&local_601);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_600);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_620,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_638,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_603[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[5]>
                           (&local_620,&local_638,(char32_t (*) [5])L"zulu");
  local_639 = 0;
  sVar1 = 0x9e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), U\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x9e,"void search_array()",local_603,&local_639);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_638);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_620);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_658,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_670,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_6f0 = &local_6e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_6f0,5);
  local_6b8._0_8_ = &local_6e8;
  local_6b8._8_8_ = 1;
  init_02._M_len = sVar1;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_6b8._0_8_,init_02);
  local_63b[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
                           (&local_658,&local_670,
                            (basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  local_6f1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), array::make({ 5 }))","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x9f,"void search_array()",local_63b,&local_6f1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  local_920 = (basic_variable<std::allocator<char>_> *)local_6b8;
  do {
    local_920 = local_920 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_920);
  } while (local_920 != &local_6e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_670);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_710,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_728,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_6f3[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
                           (&local_710,&local_728,&local_758);
  local_759 = 0;
  sVar1 = 0xa0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), array::make())","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0xa0,"void search_array()",local_6f3,&local_759);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_728);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_710);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_778,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_790,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_840 = &local_838;
  local_844 = 6;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_840,(char (*) [6])"alice",&local_844);
  local_7d8._0_8_ = &local_838;
  local_7d8._8_8_ = 1;
  init_03._M_len = sVar1;
  init_03._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7d8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_7d8._0_8_,init_03);
  local_75b[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
                           (&local_778,&local_790,
                            (basic_variable<std::allocator<char>_> *)(local_7d8 + 0x10));
  local_845 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), map::make({{ \"alice\", 6 }}))","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0xa1,"void search_array()",local_75b,&local_845);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7d8 + 0x10));
  local_940 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_7d8;
  do {
    local_940 = local_940 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_940);
  } while (local_940 != &local_838);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_790);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_778);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_860,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_878,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_847[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
                           (&local_860,&local_878,&local_8a8);
  local_8a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), map::make())","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0xa2,"void search_array()",local_847,&local_8a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_878);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_860);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void search_array()
{
    variable data = array::make({ null, true, 2, 3.0, "alpha", L"bravo", u"charlie", array::make({ 5 }), map::make({{ "alice", 6 }}) });
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), null), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), false), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), true), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), 2), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), 42), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), 3.0), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), 43.0), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), "alpha"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), "zulu"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), L"bravo"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), L"zulu"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), u"charlie"), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), u"zulu"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), U"delta"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), U"zulu"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), array::make({ 5 })), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), array::make()), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), map::make({{ "alice", 6 }})), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), map::make()), false);
}